

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiWindow *pIVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  bool bVar12;
  ImGuiContext *g;
  long lVar13;
  uint uVar14;
  ImRect *pIVar15;
  long lVar16;
  ImGuiWindow *window;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 local_38;
  undefined8 uStack_30;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if ((id == 0) ||
     ((((piVar1 = &(pIVar7->DC).NavLayerActiveMaskNext,
        *piVar1 = *piVar1 | (pIVar7->DC).NavLayerCurrentMask, pIVar10->NavId != id &&
        (pIVar10->NavAnyRequest != true)) ||
       (pIVar8 = pIVar10->NavWindow, pIVar8->RootWindowForNav != pIVar7->RootWindowForNav)) ||
      ((pIVar7 != pIVar8 && (((uint)(pIVar8->Flags | pIVar7->Flags) >> 0x17 & 1) == 0))))))
  goto LAB_0017584f;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar14 = (pIVar7->DC).ItemFlags;
  fVar19 = (pIVar7->Pos).x;
  fVar20 = (pIVar7->Pos).y;
  fVar17 = (nav_bb_arg->Min).x - fVar19;
  fVar18 = (nav_bb_arg->Min).y - fVar20;
  fVar19 = (nav_bb_arg->Max).x - fVar19;
  fVar20 = (nav_bb_arg->Max).y - fVar20;
  if ((pIVar10->NavInitRequest == true) && (pIVar10->NavLayer == (pIVar7->DC).NavLayerCurrent)) {
    if (((uVar14 & 0x10) == 0) || (pIVar10->NavInitResultId == 0)) {
      pIVar10->NavInitResultId = id;
      IVar22.y = fVar18;
      IVar22.x = fVar17;
      IVar9.y = fVar20;
      IVar9.x = fVar19;
      (pIVar10->NavInitResultRectRel).Min = IVar22;
      (pIVar10->NavInitResultRectRel).Max = IVar9;
    }
    if ((uVar14 & 0x10) == 0) {
      pIVar10->NavInitRequest = false;
      if (pIVar10->NavMoveRequest == false) {
        pIVar10->NavAnyRequest = false;
      }
      else {
        pIVar10->NavAnyRequest = true;
        if (pIVar10->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x95f,"void NavUpdateAnyRequestFlag()");
        }
      }
    }
  }
  uVar5 = pIVar10->NavId;
  if ((uVar5 != id) && ((uVar14 & 8) == 0)) {
    pIVar8 = pIVar10->NavWindow;
    lVar13 = 0x1b30;
    if (pIVar8 == pIVar7) {
      lVar13 = 0x1b00;
    }
    if ((pIVar10->NavMoveRequest == true) &&
       (iVar6 = pIVar10->NavLayer, iVar6 == (pIVar7->DC).NavLayerCurrent)) {
      local_28 = nav_bb_arg->Min;
      fVar23 = local_28.y;
      local_38 = nav_bb_arg->Max;
      pIVar10->NavScoringCount = pIVar10->NavScoringCount + 1;
      bVar11 = 1 < (uint)pIVar10->NavMoveClipDir;
      if (bVar11) {
        pIVar15 = &pIVar7->ClipRect;
        lVar16 = 0x208;
        fVar23 = local_28.x;
      }
      else {
        pIVar15 = (ImRect *)&(pIVar7->ClipRect).Min.y;
        lVar16 = 0x20c;
      }
      bVar11 = !bVar11;
      fVar21 = (pIVar15->Min).x;
      fVar24 = *(float *)((long)&pIVar7->Name + lVar16);
      fVar27 = fVar24;
      if (fVar23 <= fVar24) {
        fVar27 = fVar23;
      }
      uStack_20 = 0;
      (&local_28.x)[bVar11] =
           (float)(-(uint)(fVar23 < fVar21) & (uint)fVar21 |
                  ~-(uint)(fVar23 < fVar21) & (uint)fVar27);
      fVar27 = local_28.x;
      fVar26 = local_28.y;
      uStack_30 = 0;
      fVar23 = (&local_38.x)[bVar11];
      if (fVar23 <= fVar24) {
        fVar24 = fVar23;
      }
      (&local_38.x)[bVar11] =
           (float)(-(uint)(fVar23 < fVar21) & (uint)fVar21 |
                  ~-(uint)(fVar23 < fVar21) & (uint)fVar24);
      fVar23 = (pIVar10->NavScoringRectScreen).Min.x;
      fVar21 = (pIVar10->NavScoringRectScreen).Max.x;
      if (fVar23 <= local_38.x) {
        fVar24 = 0.0;
        if (fVar21 < fVar27) {
          fVar24 = fVar27 - fVar21;
        }
      }
      else {
        fVar24 = local_38.x - fVar23;
      }
      fVar25 = (local_38.y - fVar26) * 0.8 + fVar26;
      fVar3 = (pIVar10->NavScoringRectScreen).Min.y;
      fVar4 = (pIVar10->NavScoringRectScreen).Max.y;
      fVar28 = fVar4 - fVar3;
      fVar29 = fVar28 * 0.2 + fVar3;
      if (fVar29 <= fVar25) {
        fVar29 = (local_38.y - fVar26) * 0.2 + fVar26;
        fVar28 = fVar28 * 0.8 + fVar3;
        fVar25 = 0.0;
        if (fVar28 < fVar29) {
          fVar25 = fVar29 - fVar28;
        }
      }
      else {
        fVar25 = fVar25 - fVar29;
      }
      if (((fVar24 != 0.0) || (NAN(fVar24))) && ((fVar25 != 0.0 || (NAN(fVar25))))) {
        fVar24 = fVar24 / 1000.0 + *(float *)(&DAT_001dd7d0 + (ulong)(0.0 < fVar24) * 4);
      }
      fVar28 = ABS(fVar25) + ABS(fVar24);
      fVar21 = (local_38.x + fVar27) - (fVar23 + fVar21);
      fVar23 = (local_38.y + fVar26) - (fVar3 + fVar4);
      fVar27 = ABS(fVar21) + ABS(fVar23);
      if ((fVar25 != 0.0) || (NAN(fVar25))) {
LAB_00175c12:
        fVar23 = fVar25;
        fVar26 = fVar28;
        uVar14 = (uint)(0.0 < fVar24);
        fVar21 = fVar24;
        if (ABS(fVar24) <= ABS(fVar25)) {
          uVar14 = 0.0 < fVar25 | 2;
        }
      }
      else {
        if ((fVar24 != 0.0) || (NAN(fVar24))) goto LAB_00175c12;
        if ((((fVar21 != 0.0) || (NAN(fVar21))) || (fVar23 != 0.0)) || (NAN(fVar23))) {
          fVar26 = fVar27;
          uVar14 = (uint)(0.0 < fVar21);
          if (ABS(fVar21) <= ABS(fVar23)) {
            uVar14 = 0.0 < fVar23 | 2;
          }
        }
        else {
          fVar23 = 0.0;
          fVar26 = 0.0;
          uVar14 = (uint)(uVar5 <= (pIVar7->DC).LastItemId);
          fVar21 = 0.0;
        }
      }
      uVar5 = pIVar10->NavMoveDir;
      if (uVar14 != uVar5) goto LAB_00175cca;
      fVar3 = *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x2c);
      if (fVar3 <= fVar28) {
        if ((fVar28 != fVar3) || (NAN(fVar28) || NAN(fVar3))) {
LAB_00175cca:
          bVar11 = false;
        }
        else {
          fVar3 = *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x28);
          if (fVar3 <= fVar27) {
            if ((fVar27 == fVar3) && (!NAN(fVar27) && !NAN(fVar3))) {
              if ((uVar5 & 0xfffffffe) != 2) {
                fVar25 = fVar24;
              }
              if (fVar25 < 0.0) goto LAB_00175cc5;
            }
            goto LAB_00175cca;
          }
          *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x28) = fVar27;
LAB_00175cc5:
          bVar11 = true;
        }
        fVar24 = *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x2c);
        if (((((fVar24 == 3.4028235e+38) && (!NAN(fVar24))) && (iVar6 == 1)) &&
            ((fVar26 < *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x24) &&
             ((pIVar8->Flags & 0x10000000) == 0)))) &&
           ((((fVar21 < 0.0 && uVar5 == 0 || (0.0 < fVar21 && uVar5 == 1)) ||
             ((uVar5 == 2 && (fVar23 < 0.0)))) || ((uVar5 == 3 && (0.0 < fVar23)))))) {
          *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x24) = fVar26;
          bVar11 = true;
        }
        if (!bVar11) goto LAB_00175d73;
      }
      else {
        *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x2c) = fVar28;
        *(float *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x28) = fVar27;
      }
      *(ImGuiID *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x3c) = id;
      lVar16 = (long)(pIVar7->IDStack).Size;
      if (lVar16 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      *(uint *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x38) = (pIVar7->IDStack).Data[lVar16 + -1];
      *(ImGuiWindow **)((long)(pIVar10->IO).KeyMap + lVar13 + -0x34) = pIVar7;
      puVar2 = (undefined8 *)((long)(pIVar10->IO).KeyMap + lVar13 + -0x20);
      *puVar2 = CONCAT44(fVar18,fVar17);
      puVar2[1] = CONCAT44(fVar20,fVar19);
    }
  }
LAB_00175d73:
  if (pIVar10->NavId == id) {
    pIVar10->NavWindow = pIVar7;
    iVar6 = (pIVar7->DC).NavLayerCurrent;
    pIVar10->NavLayer = iVar6;
    pIVar10->NavIdIsAlive = true;
    pIVar10->NavIdTabCounter = pIVar7->FocusIdxTabCounter;
    pIVar15 = pIVar7->NavRectRel + iVar6;
    (pIVar15->Min).x = fVar17;
    (pIVar15->Min).y = fVar18;
    (pIVar15->Max).x = fVar19;
    (pIVar15->Max).y = fVar20;
  }
LAB_0017584f:
  (pIVar7->DC).LastItemId = id;
  IVar9 = bb->Max;
  (pIVar7->DC).LastItemRect.Min = bb->Min;
  (pIVar7->DC).LastItemRect.Max = IVar9;
  (pIVar7->DC).LastItemStatusFlags = 0;
  bVar11 = IsClippedEx(bb,id,false);
  if ((!bVar11) && (bVar12 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar12)) {
    (pIVar7->DC).LastItemStatusFlags = 1;
  }
  return !bVar11;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}